

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

vm_obj_id_t CVmObjTads::create_from_stack_multi(uint argc,int is_transient)

{
  vm_obj_id_t obj_00;
  int iVar1;
  CVmObjTable *this;
  vm_val_t *pvVar2;
  char *pcVar3;
  size_t sVar4;
  int in_ESI;
  uint in_EDI;
  vm_val_t new_obj_val;
  uint j;
  uint lst_cnt;
  vm_val_t sc_1;
  char *lstp_1;
  vm_val_t *arg_1;
  ushort i_1;
  vm_rcdesc rc;
  char *lstp;
  vm_val_t sc;
  vm_val_t *arg;
  ushort i;
  CVmObjTads *obj;
  vm_obj_id_t id;
  vm_val_t *in_stack_ffffffffffffff28;
  CVmObjTable *in_stack_ffffffffffffff30;
  vm_datatype_t in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  ushort in_stack_ffffffffffffff3e;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff40;
  uint local_b8;
  undefined4 in_stack_ffffffffffffff74;
  uint argc_00;
  ushort uVar5;
  vm_val_t *in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff86;
  vm_val_t *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff94;
  CVmRun *in_stack_ffffffffffffff98;
  vm_rcdesc *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  ushort local_1a;
  
  obj_00 = vm_new_id((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                     (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  if (in_ESI != 0) {
    CVmObjTable::set_obj_transient
              (in_stack_ffffffffffffff30,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  }
  this = (CVmObjTable *)
         CVmObject::operator_new
                   ((size_t)in_stack_ffffffffffffff30,
                    (vm_obj_id_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  CVmObjTads((CVmObjTads *)this,(ushort)((ulong)in_stack_ffffffffffffff28 >> 0x30),
             (ushort)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  CVmRun::push_obj((CVmRun *)this,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  local_1a = 0;
  while( true ) {
    uVar5 = (ushort)in_stack_ffffffffffffff74;
    if (in_EDI <= local_1a) {
      vm_rcdesc::vm_rcdesc((vm_rcdesc *)this,(char *)in_stack_ffffffffffffff28);
      argc_00 = (uint)uVar5;
      do {
        uVar5 = (ushort)(argc_00 >> 0x10);
        if (in_EDI <= uVar5) {
          CVmStack::discard(in_EDI + 1);
          return obj_00;
        }
        CVmStack::get((long)(int)(uVar5 + 1));
        pcVar3 = vm_val_t::get_as_list(in_stack_ffffffffffffff28);
        if (pcVar3 != (char *)0x0) {
          CVmObjList::index_list
                    ((vm_val_t *)in_stack_ffffffffffffff40.native_desc,
                     (char *)CONCAT26(in_stack_ffffffffffffff3e,
                                      CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
                     ,(uint)((ulong)this >> 0x20));
          sVar4 = vmb_get_len((char *)0x3460b1);
          local_b8 = (uint)sVar4;
          iVar1 = CVmStack::check_space
                            ((CVmStack *)this,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
          if (iVar1 == 0) {
            err_throw(0);
          }
          for (; 1 < local_b8; local_b8 = local_b8 - 1) {
            CVmObjList::index_and_push
                      ((char *)this,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
          }
          vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffff38,obj_00);
          in_stack_ffffffffffffff28 = (vm_val_t *)&stack0xffffffffffffff78;
          CVmRun::get_prop(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                           in_stack_ffffffffffffff88,in_stack_ffffffffffffff86,
                           in_stack_ffffffffffffff78,argc_00,in_stack_ffffffffffffffb0);
        }
        argc_00 = CONCAT22((short)(argc_00 >> 0x10) + 1,(short)argc_00);
      } while( true );
    }
    pvVar2 = CVmStack::get((long)(int)(local_1a + 1));
    pcVar3 = vm_val_t::get_as_list(in_stack_ffffffffffffff28);
    if (pcVar3 == (char *)0x0) {
      local_38 = *(undefined8 *)pvVar2;
    }
    else {
      CVmObjList::index_list
                ((vm_val_t *)in_stack_ffffffffffffff40.native_desc,
                 (char *)CONCAT26(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
                 (uint)((ulong)this >> 0x20));
    }
    if (((int)local_38 != 5) || (iVar1 = is_tadsobj_obj(0), iVar1 == 0)) break;
    iVar1 = CVmObjTable::is_obj_transient
                      (this,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    if (iVar1 != 0) {
      err_throw(0);
    }
    set_sc((CVmObjTads *)in_stack_ffffffffffffff40.native_desc,in_stack_ffffffffffffff3e,
           in_stack_ffffffffffffff38);
    local_1a = local_1a + 1;
  }
  err_throw(0);
}

Assistant:

vm_obj_id_t CVmObjTads::create_from_stack_multi(
    VMG_ uint argc, int is_transient)
{
    /* allocate an object ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    if (is_transient)
        G_obj_table->set_obj_transient(id);

    /* create the new object */
    CVmObjTads *obj = new (vmg_ id) CVmObjTads(
        vmg_ (ushort)argc, VMTOBJ_PROP_INIT);

    /* push the new object, for garbage collector protection */
    G_interpreter->push_obj(vmg_ id);

    /* set the superclasses */
    for (ushort i = 0 ; i < argc ; ++i)
    {
        /* 
         *   get this argument (it's at i+1 because of the extra item we
         *   pushed for gc protection) 
         */
        vm_val_t *arg = G_stk->get(i + 1);

        /* 
         *   if it's a list, the superclass is the first element; otherwise,
         *   the argument is the superclass 
         */
        vm_val_t sc;
        const char *lstp = arg->get_as_list(vmg0_);
        if (lstp != 0)
        {
            /* it's a list - the first element is the superclass */
            CVmObjList::index_list(vmg_ &sc, lstp, 1);
        }
        else
        {
            /* not a list - the argument is the superclass */
            sc = *arg;
        }

        /* make sure it's a TadsObject */
        if (sc.typ != VM_OBJ || !is_tadsobj_obj(vmg_ sc.val.obj))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* can't create an instance of a transient object */
        if (G_obj_table->is_obj_transient(sc.val.obj))
            err_throw(VMERR_BAD_DYNAMIC_NEW);

        /* set this superclass */
        obj->set_sc(vmg_ i, sc.val.obj);
    }

    /* set up the resursive invocation context */
    vm_rcdesc rc("TadsObject.contructMulti");

    /*
     *   The new object is ready to go.  All that remains is invoking any
     *   inherited construtors that the caller wants us to invoked.
     *   Constructor invocation is indicated by passing a list argument for
     *   the corresponding superclass, so run through the arguments and
     *   invoke each indicated constructor.  
     */
    for (ushort i = 0 ; i < argc ; ++i)
    {    
        /* get the next argument */
        vm_val_t *arg = G_stk->get(i + 1);

        /* if it's not a list, we don't want to invoke this constructor */
        const char *lstp = arg->get_as_list(vmg0_);
        if (lstp == 0)
        {
            /* no constructor call is wanted - just keep going */
            continue;
        }

        /* get the superclass from the list */
        vm_val_t sc;
        CVmObjList::index_list(vmg_ &sc, lstp, 1);

        /* get the number of list elements */
        uint lst_cnt = vmb_get_len(lstp);

        /* make sure we have room to push the arguments */
        if (!G_stk->check_space(lst_cnt - 1))
            err_throw(VMERR_STACK_OVERFLOW);

        /* 
         *   push the list elements in reverse order; don't push the first
         *   element, since it's the superclass itself rather than an
         *   argument to the constructor 
         */
        for (uint j = lst_cnt ; j > 1 ; --j)
            CVmObjList::index_and_push(vmg_ lstp, j);

        /* 
         *   Invoke the constructor via a recursive call into the VM.  Note
         *   that we're inheriting the property, so 'self' is the new object,
         *   but the 'target' object is the superclass whose constructor
         *   we're invoking. 
         */
        vm_val_t new_obj_val;
        new_obj_val.set_obj(id);
        G_interpreter->get_prop(vmg_ 0, &sc, G_predef->obj_construct,
                                &new_obj_val, lst_cnt - 1, &rc);
    }

    /* discard the arguments plus our own gc protection */
    G_stk->discard(argc + 1);

    /* return the new object */
    return id;
}